

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall GdlSetAttrItem::FixFeatureTestsInRules(GdlSetAttrItem *this,GrcFont *pfont)

{
  pointer ppGVar1;
  GdlExpression *pGVar2;
  size_t iavs;
  ulong uVar3;
  
  GdlRuleItem::FixFeatureTestsInRules(&this->super_GdlRuleItem,pfont);
  uVar3 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpavs).
              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpavs).
                      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3)
    break;
    pGVar2 = ppGVar1[uVar3]->m_pexpValue;
    (*pGVar2->_vptr_GdlExpression[0xc])(pGVar2,pfont);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void GdlSetAttrItem::FixFeatureTestsInRules(GrcFont * pfont)
{
	GdlRuleItem::FixFeatureTestsInRules(pfont);

	for (size_t iavs = 0; iavs < this->m_vpavs.size(); iavs++)
		m_vpavs[iavs]->FixFeatureTestsInRules(pfont);
}